

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenConstructor
          (string *__return_storage_ptr__,SwiftGenerator *this,string *offset)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"{{VALUETYPE}}({{ACCESS}}.bb, o: ",offset);
  std::operator+(__return_storage_ptr__,&local_30,") }");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GenConstructor(const std::string &offset) {
    return "{{VALUETYPE}}({{ACCESS}}.bb, o: " + offset + ") }";
  }